

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  settings par;
  
  settings::settings(&par,argc,argv);
  cppcms::impl::setup_logging(&par.config);
  main_posix(&par);
  settings::~settings(&par);
  return 0;
}

Assistant:

int main(int argc,char **argv)
{
	try 
	{
		settings par(argc,argv);	
		cppcms::impl::setup_logging(par.config);
#ifndef CPPCMS_WIN32
		main_posix(par);
#elif defined CPPCMS_WIN_NATIVE
		if(cppcms::impl::winservice::is_console(par.config))
			main_console(par);
		else
			main_win(par,argc,argv);
#else // cygwin
		main_console(par);
#endif

	}
	catch(std::exception const &e) {
		BOOSTER_ERROR("cppcms_scale")<<e.what()<<booster::trace(e);
		return 1;
	}
	return 0;
}